

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mcpl_fileutils.c
# Opt level: O2

mcu8str * mcu8str_create(mcu8str *__return_storage_ptr__,mcu8str_size_t prealloc_size)

{
  int iVar1;
  char *pcVar2;
  uint uVar3;
  
  if (prealloc_size == 0) {
    __return_storage_ptr__->c_str = mcu8str_create_empty::dummy;
    __return_storage_ptr__->size = 0;
    uVar3 = 0;
    iVar1 = 0;
LAB_001071db:
    __return_storage_ptr__->buflen = uVar3;
    __return_storage_ptr__->owns_memory = iVar1;
    return __return_storage_ptr__;
  }
  if (prealloc_size >> 1 < 0x7fffffff) {
    pcVar2 = (char *)malloc(prealloc_size + 1);
    __return_storage_ptr__->c_str = pcVar2;
    if (pcVar2 != (char *)0x0) {
      __return_storage_ptr__->size = 0;
      *pcVar2 = '\0';
      uVar3 = (int)prealloc_size + 1;
      iVar1 = 1;
      goto LAB_001071db;
    }
  }
  else {
    __return_storage_ptr__->c_str = (char *)0x0;
  }
  fwrite("ERROR: Memory allocation failed in mcu8str_create\n",0x32,1,_stderr);
  exit(1);
}

Assistant:

mcu8str mcu8str_create( mcu8str_size_t prealloc_size )
  {
    MCTOOLS_STATIC_ASSERT( sizeof(int)==sizeof(unsigned) );
    MCTOOLS_STATIC_ASSERT( sizeof(size_t)>=sizeof(unsigned) );
    MCTOOLS_STATIC_ASSERT( sizeof(unsigned)>=4 );
    MCTOOLS_STATIC_ASSERT( sizeof(size_t)>=4 );
    MCTOOLS_STATIC_ASSERT( sizeof(void*)>=4 );

    if ( prealloc_size == 0 )
      return mcu8str_create_empty();
    mcu8str s;
    //Limit prealloc_size, since we use unsigned type to store the size in
    //buflen below:
    s.c_str = (char*) ( MCTOOLS_STROKFORUINT(prealloc_size)
                        ? STDNS malloc( prealloc_size+1 ) : NULL);
    if ( !s.c_str ) {
#ifdef MCFILEUTILS_CPPNAMESPACE
      throw std::bad_alloc();
#else
      fprintf(stderr, "ERROR: Memory allocation failed in mcu8str_create\n");
      exit(EXIT_FAILURE);
#endif
      //gives (correctly but annoyingly) unreachable warning with MSVC
      //return mcu8str_create_empty();
    }
    s.c_str[0] = '\0';
    s.size = 0;
    s.buflen = (unsigned)(prealloc_size + 1);//cast ok, checked above
    s.owns_memory = 1;
    return s;
  }